

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MacMessage0.c
# Opt level: O0

_Bool COSE_Mac0_SetContent(HCOSE_MAC0 cose,byte *rgbContent,size_t cbContent,cose_errback *perr)

{
  _Bool _Var1;
  cose_error cVar2;
  cn_cbor_errback local_48;
  cn_cbor_errback cbor_error;
  cn_cbor *ptmp;
  COSE_Mac0Message *p;
  cose_errback *perr_local;
  size_t cbContent_local;
  byte *rgbContent_local;
  HCOSE_MAC0 cose_local;
  
  cbor_error.pos = 0;
  cbor_error.err = CN_CBOR_NO_ERROR;
  _Var1 = IsValidMac0Handle(cose);
  if (_Var1) {
    cbor_error = (cn_cbor_errback)cn_cbor_data_create(rgbContent,(int)cbContent,&local_48);
    if (cbor_error == (cn_cbor_errback)0x0) {
      if (perr != (cose_errback *)0x0) {
        cVar2 = _MapFromCBOR(local_48);
        perr->err = cVar2;
      }
    }
    else {
      _Var1 = _COSE_array_replace((COSE *)cose,(cn_cbor *)cbor_error,2,&local_48);
      if (_Var1) {
        return true;
      }
      if (perr != (cose_errback *)0x0) {
        cVar2 = _MapFromCBOR(local_48);
        perr->err = cVar2;
      }
    }
  }
  else if (perr != (cose_errback *)0x0) {
    perr->err = COSE_ERR_INVALID_PARAMETER;
  }
  if (cbor_error != (cn_cbor_errback)0x0) {
    cn_cbor_free((cn_cbor *)cbor_error);
  }
  return false;
}

Assistant:

bool COSE_Mac0_SetContent(HCOSE_MAC0 cose, const byte * rgbContent, size_t cbContent, cose_errback * perr)
{
	COSE_Mac0Message * p = (COSE_Mac0Message *)cose;
#ifdef USE_CBOR_CONTEXT        
	cn_cbor_context * context = &p->m_message.m_allocContext;
#endif
	cn_cbor * ptmp = NULL;
	cn_cbor_errback cbor_error;

	CHECK_CONDITION(IsValidMac0Handle(cose), COSE_ERR_INVALID_PARAMETER);

	ptmp = cn_cbor_data_create(rgbContent, (int) cbContent, CBOR_CONTEXT_PARAM_COMMA &cbor_error);
	CHECK_CONDITION_CBOR(ptmp != NULL, cbor_error);

	CHECK_CONDITION_CBOR(_COSE_array_replace(&p->m_message, ptmp, INDEX_BODY, CBOR_CONTEXT_PARAM_COMMA &cbor_error),  cbor_error);
	ptmp = NULL;

	return true;

errorReturn:
	if (ptmp != NULL) CN_CBOR_FREE(ptmp, context);
	return false;
}